

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

errr grab_effect_data(parser *p,effect *effect)

{
  _Bool _Var1;
  errr eVar2;
  wchar_t wVar3;
  char *what;
  wchar_t local_2c;
  char *pcStack_28;
  wchar_t val;
  char *type;
  effect *effect_local;
  parser *p_local;
  
  type = (char *)effect;
  effect_local = (effect *)p;
  what = parser_getsym(p,"eff");
  eVar2 = grab_name("effect",what,effect_list,0x72,&local_2c);
  if (eVar2 != 0) {
    return 9;
  }
  *(short *)(type + 8) = (short)local_2c;
  _Var1 = parser_hasval((parser *)effect_local,"type");
  if (_Var1) {
    pcStack_28 = parser_getsym((parser *)effect_local,"type");
    if (pcStack_28 == (char *)0x0) {
      return 0x3d;
    }
    local_2c = effect_subtype((uint)*(ushort *)(type + 8),pcStack_28);
    if (local_2c < L'\0') {
      return 0x1e;
    }
    *(wchar_t *)(type + 0x20) = local_2c;
  }
  _Var1 = parser_hasval((parser *)effect_local,"radius");
  if (_Var1) {
    wVar3 = parser_getint((parser *)effect_local,"radius");
    *(wchar_t *)(type + 0x24) = wVar3;
  }
  _Var1 = parser_hasval((parser *)effect_local,"other");
  if (_Var1) {
    wVar3 = parser_getint((parser *)effect_local,"other");
    *(wchar_t *)(type + 0x28) = wVar3;
  }
  return 0;
}

Assistant:

errr grab_effect_data(struct parser *p, struct effect *effect)
{
	const char *type;
	int val;

	if (grab_name("effect", parser_getsym(p, "eff"), effect_list,
				  N_ELEMENTS(effect_list), &val))
		return PARSE_ERROR_INVALID_EFFECT;
	effect->index = val;

	if (parser_hasval(p, "type")) {
		type = parser_getsym(p, "type");

		if (type == NULL)
			return PARSE_ERROR_UNRECOGNISED_PARAMETER;

		/* Check for a value */
		val = effect_subtype(effect->index, type);
		if (val < 0)
			return PARSE_ERROR_INVALID_VALUE;
		else
			effect->subtype = val;
	}

	if (parser_hasval(p, "radius"))
		effect->radius = parser_getint(p, "radius");

	if (parser_hasval(p, "other"))
		effect->other = parser_getint(p, "other");

	return PARSE_ERROR_NONE;
}